

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_utils.c
# Opt level: O2

void CGTFS_FileUtils(void)

{
  FILE *pFVar1;
  char **arr;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FILE *pFVar6;
  int i;
  long lVar7;
  int it_in_expected;
  long lVar8;
  size_t sz;
  int j;
  long lVar9;
  char **local_48;
  char **field_names;
  FILE *local_38;
  
  iVar2 = greatest_test_pre("file_utils_read_header_0");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/agency.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0xe;
        greatest_info.msg = "Couldn\'t open `data/agency.txt` test file";
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
        iVar2 = -1;
      }
      else {
        uVar3 = read_header((FILE *)pFVar6,&field_names);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar3 == 6) {
          lVar7 = 0;
          do {
            if (lVar7 == 0x18) {
              free_cstr_arr(field_names,6);
              fclose(pFVar6);
              greatest_info.msg = (char *)0x0;
              iVar2 = 0;
              goto LAB_0011d486;
            }
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar2 = greatest_do_assert_equal_t
                              ((void *)((long)&DAT_001d5134 +
                                       (long)*(int *)((long)&DAT_001d5134 + lVar7)),
                               *(void **)((long)field_names + lVar7 * 2),&greatest_type_info_string,
                               (void *)0x0);
            lVar7 = lVar7 + 4;
          } while (iVar2 != 0);
          greatest_info.fail_line = 0x21;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
            greatest_info.msg = "type_info->equal callback missing!";
          }
          else {
            greatest_info.msg = "correct_field_names[i] != field_names[i]";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",6);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar3);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x1e;
          greatest_info.msg = "Counted wrong number of fields in the header";
        }
        iVar2 = -1;
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
      }
    }
LAB_0011d486:
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_read_header_1");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/routes.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x2d;
        greatest_info.msg = "Couldn\'t open `data/routes.txt` test file";
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
        iVar2 = -1;
      }
      else {
        uVar3 = read_header((FILE *)pFVar6,&field_names);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar3 == 7) {
          lVar7 = 0;
          do {
            if (lVar7 == 0x1c) {
              free_cstr_arr(field_names,7);
              fclose(pFVar6);
              greatest_info.msg = (char *)0x0;
              iVar2 = 0;
              goto LAB_0011d66e;
            }
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar2 = greatest_do_assert_equal_t
                              ((void *)((long)&DAT_001d514c +
                                       (long)*(int *)((long)&DAT_001d514c + lVar7)),
                               *(void **)((long)field_names + lVar7 * 2),&greatest_type_info_string,
                               (void *)0x0);
            lVar7 = lVar7 + 4;
          } while (iVar2 != 0);
          greatest_info.fail_line = 0x41;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
            greatest_info.msg = "type_info->equal callback missing!";
          }
          else {
            greatest_info.msg = "correct_field_names[i] != field_names[i]";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",7);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar3);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x3e;
          greatest_info.msg = "Counted wrong number of fields in the header";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
        iVar2 = -1;
      }
    }
LAB_0011d66e:
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_read_header_2_empty");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/empty.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x4c;
        greatest_info.msg = "Couldn\'t open `data/empty.txt` test file";
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
        iVar2 = -1;
      }
      else {
        field_names = (char **)0x0;
        uVar3 = read_header((FILE *)pFVar6,&field_names);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar3 == 0xffffffff) {
          free_cstr_arr(field_names,0xffffffffffffffff);
          fclose(pFVar6);
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0xffffffffffffffff);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar3);
          fputc(10,_stdout);
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
          ;
          greatest_info.fail_line = 0x52;
          greatest_info.msg = "Counted some fields in an empty header";
          iVar2 = -1;
          if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
        }
      }
    }
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_read_header_3_badfile");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/doesntexist.txt","r");
      uVar3 = read_header((FILE *)pFVar6,&field_names);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar3 == 0xffffffff) {
        free_cstr_arr(field_names,0xffffffffffffffff);
        if (pFVar6 != (FILE *)0x0) {
          fclose(pFVar6);
        }
        greatest_info.msg = (char *)0x0;
        iVar2 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffffffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar3);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x61;
        greatest_info.msg = "Somehow opened the file that doesn\'t exist";
        iVar2 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
      }
    }
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_read_record_0");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/agency.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x72;
        greatest_info.msg = "Couldn\'t open `data/agency.txt` test file";
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
        iVar2 = -1;
      }
      else {
        iVar2 = read_header((FILE *)pFVar6,&field_names);
        sz = (size_t)iVar2;
        iVar5 = 0;
        local_38 = pFVar6;
        while (iVar4 = read_record((FILE *)pFVar6,iVar2,&local_48), 0 < iVar4) {
          if (iVar5 == 3) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar4 = greatest_do_assert_equal_t("4",*local_48,&greatest_type_info_string,(void *)0x0)
            ;
            if (iVar4 == 0) {
              greatest_info.fail_line = 0x8d;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011e075;
              greatest_info.msg = "\"4\" != record_values[0]";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar4 = greatest_do_assert_equal_t
                                (anon_var_dwarf_1f17,local_48[1],&greatest_type_info_string,
                                 (void *)0x0);
              if (iVar4 == 0) {
                greatest_info.fail_line = 0x8e;
                if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011e075;
                greatest_info.msg = anon_var_dwarf_1f22;
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar4 = greatest_do_assert_equal_t
                                  ("http://www.lsl.fi",local_48[2],&greatest_type_info_string,
                                   (void *)0x0);
                if (iVar4 == 0) {
                  greatest_info.fail_line = 0x8f;
                  if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                  goto LAB_0011e075;
LAB_0011ded3:
                  greatest_info.msg = "\"http://www.lsl.fi\" != record_values[2]";
                }
                else {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar4 = greatest_do_assert_equal_t
                                    ("blah \"HELLO\" blah",local_48[3],&greatest_type_info_string,
                                     (void *)0x0);
                  if (iVar4 == 0) {
                    greatest_info.fail_line = 0x90;
                    if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                    goto LAB_0011e075;
                    greatest_info.msg = "\"blah \\\"HELLO\\\" blah\" != record_values[3]";
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar4 = greatest_do_assert_equal_t
                                      ("fi",local_48[4],&greatest_type_info_string,(void *)0x0);
                    if (iVar4 == 0) {
                      greatest_info.fail_line = 0x91;
                      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                      goto LAB_0011e075;
LAB_0011dfc2:
                      greatest_info.msg = "\"fi\" != record_values[4]";
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 1;
                      iVar4 = greatest_do_assert_equal_t
                                        ("03 814 2355",local_48[5],&greatest_type_info_string,
                                         (void *)0x0);
                      if (iVar4 != 0) goto LAB_0011dc9d;
                      greatest_info.fail_line = 0x92;
                      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                      goto LAB_0011e075;
LAB_0011e04a:
                      greatest_info.msg = "\"03 814 2355\" != record_values[5]";
                    }
                  }
                }
              }
            }
LAB_0011e07c:
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
            ;
            if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
            iVar2 = -1;
            goto LAB_0011e095;
          }
          if (iVar5 == 2) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar4 = greatest_do_assert_equal_t("3",*local_48,&greatest_type_info_string,(void *)0x0)
            ;
            if (iVar4 == 0) {
              greatest_info.fail_line = 0x85;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011e075;
              greatest_info.msg = "\"3\" != record_values[0]";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar4 = greatest_do_assert_equal_t
                                ("",local_48[1],&greatest_type_info_string,(void *)0x0);
              if (iVar4 == 0) {
                greatest_info.fail_line = 0x86;
                if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011e075;
                greatest_info.msg = anon_var_dwarf_1f22 + 0x20;
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar4 = greatest_do_assert_equal_t
                                  ("",local_48[2],&greatest_type_info_string,(void *)0x0);
                if (iVar4 == 0) {
                  greatest_info.fail_line = 0x87;
                  if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                  goto LAB_0011e075;
                  greatest_info.msg = "\"\" != record_values[2]";
                }
                else {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar4 = greatest_do_assert_equal_t
                                    ("",local_48[3],&greatest_type_info_string,(void *)0x0);
                  if (iVar4 == 0) {
                    greatest_info.fail_line = 0x88;
                    if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                    goto LAB_0011e075;
                    greatest_info.msg = "\"\" != record_values[3]";
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar4 = greatest_do_assert_equal_t
                                      ("",local_48[4],&greatest_type_info_string,(void *)0x0);
                    if (iVar4 == 0) {
                      greatest_info.fail_line = 0x89;
                      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                      goto LAB_0011e075;
                      greatest_info.msg = "\"\" != record_values[4]";
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 1;
                      iVar4 = greatest_do_assert_equal_t
                                        ("",local_48[5],&greatest_type_info_string,(void *)0x0);
                      pFVar6 = local_38;
                      if (iVar4 != 0) goto LAB_0011dc9d;
                      greatest_info.fail_line = 0x8a;
                      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                      goto LAB_0011e075;
                      greatest_info.msg = "\"\" != record_values[5]";
                    }
                  }
                }
              }
            }
            goto LAB_0011e07c;
          }
          if (iVar5 == 0) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar4 = greatest_do_assert_equal_t("1",*local_48,&greatest_type_info_string,(void *)0x0)
            ;
            if (iVar4 == 0) {
              greatest_info.fail_line = 0x7d;
              if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                greatest_info.msg = "\"1\" != record_values[0]";
                goto LAB_0011e07c;
              }
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar4 = greatest_do_assert_equal_t
                                ("Lahden Seudun Liikenne",local_48[1],&greatest_type_info_string,
                                 (void *)0x0);
              if (iVar4 == 0) {
                greatest_info.fail_line = 0x7e;
                if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                  greatest_info.msg = "\"Lahden Seudun Liikenne\" != record_values[1]";
                  goto LAB_0011e07c;
                }
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar4 = greatest_do_assert_equal_t
                                  ("http://www.lsl.fi",local_48[2],&greatest_type_info_string,
                                   (void *)0x0);
                if (iVar4 == 0) {
                  greatest_info.fail_line = 0x7f;
                  if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0)
                  goto LAB_0011ded3;
                }
                else {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar4 = greatest_do_assert_equal_t
                                    ("Europe/Helsinki",local_48[3],&greatest_type_info_string,
                                     (void *)0x0);
                  if (iVar4 == 0) {
                    greatest_info.fail_line = 0x80;
                    if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                      greatest_info.msg = "\"Europe/Helsinki\" != record_values[3]";
                      goto LAB_0011e07c;
                    }
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar4 = greatest_do_assert_equal_t
                                      ("fi",local_48[4],&greatest_type_info_string,(void *)0x0);
                    if (iVar4 == 0) {
                      greatest_info.fail_line = 0x81;
                      if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0)
                      goto LAB_0011dfc2;
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 1;
                      iVar4 = greatest_do_assert_equal_t
                                        ("03 814 2355",local_48[5],&greatest_type_info_string,
                                         (void *)0x0);
                      if (iVar4 != 0) goto LAB_0011dc9d;
                      greatest_info.fail_line = 0x82;
                      if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0)
                      goto LAB_0011e04a;
                    }
                  }
                }
              }
            }
LAB_0011e075:
            greatest_info.msg = "type_info->equal callback missing!";
            goto LAB_0011e07c;
          }
LAB_0011dc9d:
          iVar5 = iVar5 + 1;
          free_cstr_arr(local_48,sz);
        }
        free_cstr_arr(field_names,sz);
        free_cstr_arr(local_48,sz);
        fclose(pFVar6);
        greatest_info.msg = (char *)0x0;
        iVar2 = 0;
      }
    }
LAB_0011e095:
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_read_record_1_empty");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/empty.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0xa6;
        greatest_info.msg = "Couldn\'t open `data/empty.txt` test file";
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
        iVar2 = -1;
      }
      else {
        uVar3 = read_header((FILE *)pFVar6,&field_names);
        if (uVar3 == 0xffffffff) {
          greatest_info.assertions = greatest_info.assertions + 2;
          iVar2 = read_record((FILE *)pFVar6,-1,&local_48);
          if (iVar2 == -1) {
            free_cstr_arr(field_names,0xffffffffffffffff);
            free_cstr_arr(local_48,0xffffffffffffffff);
            fclose(pFVar6);
            greatest_info.msg = (char *)0x0;
            iVar2 = 0;
            goto LAB_0011e300;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0xffffffff);
          fwrite("\n     Got: ",0xb,1,_stdout);
          pFVar1 = _stdout;
          uVar3 = read_record((FILE *)pFVar6,-1,&local_48);
          fprintf(pFVar1,"%i",(ulong)uVar3);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xae;
          greatest_info.msg = "Somehow read a record that doesn\'t exist";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0xffffffffffffffff);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar3);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xab;
          greatest_info.msg = "Somehow read the header of an empty file";
        }
        iVar2 = -1;
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
      }
    }
LAB_0011e300:
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_read_record_2_badfile");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/doesntexist.txt","r");
      uVar3 = read_header((FILE *)pFVar6,&field_names);
      if (uVar3 == 0xffffffff) {
        greatest_info.assertions = greatest_info.assertions + 2;
        iVar2 = read_record((FILE *)pFVar6,-1,&local_48);
        if (iVar2 == -1) {
          free_cstr_arr(field_names,0xffffffffffffffff);
          free_cstr_arr(local_48,0xffffffffffffffff);
          if (pFVar6 != (FILE *)0x0) {
            fclose(pFVar6);
          }
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_0011e52c;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        pFVar1 = _stdout;
        uVar3 = read_record((FILE *)pFVar6,-1,&local_48);
        fprintf(pFVar1,"%i",(ulong)uVar3);
        fputc(10,_stdout);
        greatest_info.fail_line = 0xc1;
        greatest_info.msg = "Somehow read a record from a file that doesn\'t exist";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffffffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar3);
        fputc(10,_stdout);
        greatest_info.fail_line = 0xbe;
        greatest_info.msg = "Somehow read the header of a nonexisting file";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      iVar2 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
    }
LAB_0011e52c:
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_count_lines_0");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/agency.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0xd4;
        greatest_info.msg = "Couldn\'t open `data/agency.txt` test file";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = count_lines((FILE *)pFVar6);
        if (iVar2 == 5) {
          fclose(pFVar6);
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_0011e5f4;
        }
        greatest_info.fail_line = 0xd6;
        greatest_info.msg = "5 != count_lines(fp)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
      iVar2 = -1;
    }
LAB_0011e5f4:
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_count_lines_1");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/empty.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0xdf;
        greatest_info.msg = "Couldn\'t open `data/empty.txt` test file";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = count_lines((FILE *)pFVar6);
        if (iVar2 == 0) {
          fclose(pFVar6);
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_0011e6bb;
        }
        greatest_info.fail_line = 0xe1;
        greatest_info.msg = "0 != count_lines(fp)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
      iVar2 = -1;
    }
LAB_0011e6bb:
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_count_lines_2");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/only_nl.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0xea;
        greatest_info.msg = "Couldn\'t open `data/only_nl.txt` test file";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = count_lines((FILE *)pFVar6);
        if (iVar2 == 2) {
          fclose(pFVar6);
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_0011e783;
        }
        greatest_info.fail_line = 0xec;
        greatest_info.msg = "2 != count_lines(fp)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
      iVar2 = -1;
    }
LAB_0011e783:
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_count_lines_3_badfile");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      pFVar6 = fopen("../tests/data/doesntexist.txt","r");
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = count_lines((FILE *)pFVar6);
      if (iVar2 == -1) {
        if (pFVar6 != (FILE *)0x0) {
          fclose(pFVar6);
        }
        greatest_info.msg = (char *)0x0;
        iVar2 = 0;
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0xf4;
        greatest_info.msg = "-1 != count_lines(fp)";
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
        iVar2 = -1;
      }
    }
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_list_files_1");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      uVar3 = list_txt_files("../tests/data/google_sample",&field_names);
      arr = field_names;
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar3 == 0xb) {
        lVar7 = 0;
        do {
          if (lVar7 == 0xb) {
            free_cstr_arr(arr,0xb);
            greatest_info.msg = (char *)0x0;
            iVar2 = 0;
            goto LAB_0011e9a7;
          }
          iVar2 = (&DAT_001d5168)[lVar7];
          lVar8 = 0;
          for (lVar9 = lVar8; lVar9 != 0xb; lVar9 = lVar9 + 1) {
            iVar5 = strcmp(arr[lVar9],(char *)((long)&DAT_001d5168 + (long)iVar2));
            if (iVar5 == 0) {
              lVar8 = 1;
            }
          }
          lVar7 = lVar7 + 1;
        } while ((int)lVar8 != 0);
        greatest_info.fail_line = 0x117;
        greatest_info.msg = "An expected filename not found in the result array";
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xb);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar3);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x10f;
        greatest_info.msg = "CGTFS_FILE_UTILS_LIST_1_SIZE != file_count";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
      iVar2 = -1;
    }
LAB_0011e9a7:
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_list_files_2_nofiles");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      uVar3 = list_txt_files("../tests/data/no_txt_files_dir",&field_names);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar3 == 0) {
        free_cstr_arr(field_names,0);
        greatest_info.msg = (char *)0x0;
        iVar2 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar3);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x123;
        greatest_info.msg = "0 != file_count";
        if ((greatest_info.flags & 4) != 0) goto LAB_0011ebaf;
        iVar2 = -1;
      }
    }
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("file_utils_list_files_3_nodir");
  if (iVar2 != 0) {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      uVar3 = list_txt_files("../tests/data/dir_not_found",&field_names);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar3 == 0xffffffff) {
        greatest_info.msg = (char *)0x0;
        iVar2 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffffffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar3);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x12d;
        greatest_info.msg = "-1 != file_count";
        iVar2 = -1;
        if ((greatest_info.flags & 4) != 0) {
LAB_0011ebaf:
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
          ;
          abort();
        }
      }
    }
    greatest_test_post(iVar2);
  }
  return;
}

Assistant:

SUITE(CGTFS_FileUtils) {
    RUN_TEST(file_utils_read_header_0);
    RUN_TEST(file_utils_read_header_1);
    RUN_TEST(file_utils_read_header_2_empty);
    RUN_TEST(file_utils_read_header_3_badfile);

    RUN_TEST(file_utils_read_record_0);
    RUN_TEST(file_utils_read_record_1_empty);
    RUN_TEST(file_utils_read_record_2_badfile);

    RUN_TEST(file_utils_count_lines_0);
    RUN_TEST(file_utils_count_lines_1);
    RUN_TEST(file_utils_count_lines_2);
    RUN_TEST(file_utils_count_lines_3_badfile);

    RUN_TEST(file_utils_list_files_1);
    RUN_TEST(file_utils_list_files_2_nofiles);
    RUN_TEST(file_utils_list_files_3_nodir);
}